

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,SrcXprType *src,assign_op<double,_double> *param_3
          )

{
  Index rows;
  Index cols;
  Index IVar1;
  LhsNestedCleaned *lhs;
  RhsNestedCleaned *rhs;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  SrcXprType *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  rows = Product<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
         ::rows(src);
  cols = Product<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
         ::cols(src);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar1 == rows) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar1 == cols) goto LAB_001f5b5d;
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,rows,cols);
LAB_001f5b5d:
  lhs = Product<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
        ::lhs(src);
  rhs = Product<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_2U>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
        ::rhs(src);
  generic_product_impl_base<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,1,-1,-1>,2u>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::generic_product_impl<Eigen::TriangularView<Eigen::Matrix<double,-1,-1,1,-1,-1>,2u>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::TriangularShape,Eigen::DenseShape,8>>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>(dst,lhs,rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }